

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7decomp.cpp
# Opt level: O0

bool bc7decomp::unpack_bc7_mode1_3_7(uint32_t mode,void *pBlock_bits,color_rgba *pPixels)

{
  uint32_t uVar1;
  uint uVar2;
  uint8_t *puVar3;
  byte *pbVar4;
  long in_RDX;
  int in_EDI;
  uint32_t i_2;
  uint32_t c_2;
  uint32_t i_1;
  uint32_t s;
  color_rgba block_colors [2] [8];
  uint32_t c_1;
  uint32_t e_1;
  uint32_t i;
  uint32_t weights [16];
  uint32_t p;
  uint32_t pbits [4];
  uint32_t e;
  uint32_t c;
  color_rgba endpoints [4];
  uint32_t part;
  uint8_t *pBuf;
  uint32_t bit_offset;
  uint32_t WEIGHT_VALS;
  uint32_t SHARED_PBITS;
  uint32_t PBITS;
  uint32_t ENDPOINT_BITS;
  uint32_t WEIGHT_BITS;
  uint32_t COMPS;
  uint32_t ENDPOINTS;
  uint32_t in_stack_fffffffffffffe68;
  uint in_stack_fffffffffffffe6c;
  undefined8 in_stack_fffffffffffffe80;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar5;
  uint32_t *in_stack_fffffffffffffe88;
  anon_union_4_2_6eba8969_for_color_rgba_0 *this;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  uint local_168;
  uint8_t local_160;
  color_rgba *local_138;
  uint32_t local_12c;
  uint local_128;
  uint32_t local_124;
  uint local_120;
  uint local_11c;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_118 [16];
  anon_union_4_2_6eba8969_for_color_rgba_0 aStack_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint32_t auStack_c8 [19];
  uint local_7c;
  uint32_t auStack_78 [6];
  uint local_60;
  uint local_5c;
  color_rgba local_58 [4];
  color_rgba cStack_48;
  uint32_t local_44;
  undefined4 local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint32_t local_28;
  undefined4 local_24;
  uint local_20;
  undefined4 local_1c;
  long local_18;
  int local_8;
  bool local_1;
  
  local_1c = 4;
  local_20 = 3;
  if (in_EDI == 7) {
    local_20 = 4;
  }
  local_24 = 2;
  if (in_EDI == 1) {
    local_24 = 3;
  }
  if (in_EDI == 7) {
    local_12c = 5;
  }
  else {
    local_12c = 7;
    if (in_EDI == 1) {
      local_12c = 6;
    }
  }
  local_28 = local_12c;
  local_2c = (in_EDI != 1) + 2 + (uint)(in_EDI != 1);
  local_30 = (uint)(-(in_EDI == 1) & 1);
  local_34 = 1 << (sbyte)local_24;
  local_38 = 0;
  local_18 = in_RDX;
  local_8 = in_EDI;
  uVar1 = read_bits32((uint8_t *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                      in_stack_fffffffffffffe88,(uint32_t)((ulong)in_stack_fffffffffffffe80 >> 0x20)
                     );
  if (uVar1 == 1 << ((byte)local_8 & 0x1f)) {
    local_44 = read_bits32((uint8_t *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                           in_stack_fffffffffffffe88,
                           (uint32_t)((ulong)in_stack_fffffffffffffe80 >> 0x20));
    local_138 = local_58;
    do {
      color_rgba::color_rgba(local_138);
      local_138 = local_138 + 1;
    } while (local_138 != &cStack_48);
    for (local_5c = 0; local_5c < local_20; local_5c = local_5c + 1) {
      for (local_60 = 0; local_60 < 4; local_60 = local_60 + 1) {
        uVar1 = read_bits32((uint8_t *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90)
                            ,in_stack_fffffffffffffe88,
                            (uint32_t)((ulong)in_stack_fffffffffffffe80 >> 0x20));
        puVar3 = color_rgba::operator[](local_58 + local_60,local_5c);
        *puVar3 = (uint8_t)uVar1;
      }
    }
    for (local_7c = 0; local_7c < local_2c; local_7c = local_7c + 1) {
      uVar1 = read_bits32((uint8_t *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                          in_stack_fffffffffffffe88,
                          (uint32_t)((ulong)in_stack_fffffffffffffe80 >> 0x20));
      auStack_78[local_7c] = uVar1;
    }
    for (local_cc = 0; local_cc < 0x10; local_cc = local_cc + 1) {
      uVar1 = read_bits32((uint8_t *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                          in_stack_fffffffffffffe88,
                          (uint32_t)((ulong)in_stack_fffffffffffffe80 >> 0x20));
      auStack_c8[local_cc] = uVar1;
    }
    for (local_d0 = 0; local_d0 < 4; local_d0 = local_d0 + 1) {
      for (local_d4 = 0; local_d4 < 4; local_d4 = local_d4 + 1) {
        uVar2 = 3;
        if (local_8 == 7) {
          uVar2 = 4;
        }
        if (local_d4 == uVar2) {
          local_160 = 0xff;
        }
        else {
          pbVar4 = color_rgba::operator[](local_58 + local_d0,local_d4);
          if (local_30 == 0) {
            local_168 = local_d0;
          }
          else {
            local_168 = local_d0 >> 1;
          }
          uVar1 = bc7_dequant((uint)*pbVar4,auStack_78[local_168],local_28);
          local_160 = (uint8_t)uVar1;
        }
        puVar3 = color_rgba::operator[](local_58 + local_d0,local_d4);
        *puVar3 = local_160;
      }
    }
    this = local_118;
    paVar5 = &aStack_d8;
    do {
      color_rgba::color_rgba((color_rgba *)&this->field_1);
      this = this + 1;
    } while (this != paVar5);
    for (local_11c = 0; local_11c < 2; local_11c = local_11c + 1) {
      for (local_120 = 0; local_120 < local_34; local_120 = local_120 + 1) {
        for (local_124 = 0; local_124 < local_20; local_124 = local_124 + 1) {
          pbVar4 = color_rgba::operator[](local_58 + (local_11c << 1),local_124);
          uVar2 = (uint)*pbVar4;
          color_rgba::operator[](local_58 + (local_11c * 2 + 1),local_124);
          uVar1 = bc7_interp(uVar2,in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68,0);
          puVar3 = color_rgba::operator[]
                             ((color_rgba *)
                              &local_118[(ulong)local_11c * 8 + (ulong)local_120].field_1,local_124)
          ;
          *puVar3 = (uint8_t)uVar1;
        }
        if (local_20 == 3) {
          in_stack_fffffffffffffe6c = 0xff;
        }
        else {
          pbVar4 = color_rgba::operator[]
                             ((color_rgba *)
                              &local_118[(ulong)local_11c * 8 + (ulong)local_120].field_1,3);
          in_stack_fffffffffffffe6c = (uint)*pbVar4;
        }
        in_stack_fffffffffffffe68 =
             CONCAT13((char)in_stack_fffffffffffffe6c,(int3)in_stack_fffffffffffffe68);
        puVar3 = color_rgba::operator[]
                           ((color_rgba *)
                            &local_118[(ulong)local_11c * 8 + (ulong)local_120].field_1,3);
        *puVar3 = (uint8_t)(in_stack_fffffffffffffe68 >> 0x18);
      }
    }
    for (local_128 = 0; local_128 < 0x10; local_128 = local_128 + 1) {
      *(anon_union_4_2_6eba8969_for_color_rgba_0 *)(local_18 + (ulong)local_128 * 4) =
           local_118[(ulong)(byte)g_bc7_partition2[local_44 * 0x10 + local_128] * 8 +
                     (ulong)auStack_c8[local_128]];
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool unpack_bc7_mode1_3_7(uint32_t mode, const void* pBlock_bits, color_rgba* pPixels)
{
	//const uint32_t SUBSETS = 2;
	const uint32_t ENDPOINTS = 4;
	const uint32_t COMPS = (mode == 7) ? 4 : 3;
	const uint32_t WEIGHT_BITS = (mode == 1) ? 3 : 2;
	const uint32_t ENDPOINT_BITS = (mode == 7) ? 5 : ((mode == 1) ? 6 : 7);
	const uint32_t PBITS = (mode == 1) ? 2 : 4;
	const uint32_t SHARED_PBITS = (mode == 1) ? true : false;
	const uint32_t WEIGHT_VALS = 1 << WEIGHT_BITS;
		
	uint32_t bit_offset = 0;
	const uint8_t* pBuf = static_cast<const uint8_t*>(pBlock_bits);

	if (read_bits32(pBuf, bit_offset, mode + 1) != (1U << mode)) return false;

	const uint32_t part = read_bits32(pBuf, bit_offset, 6);

	color_rgba endpoints[ENDPOINTS];
	for (uint32_t c = 0; c < COMPS; c++)
		for (uint32_t e = 0; e < ENDPOINTS; e++)
			endpoints[e][c] = (uint8_t)read_bits32(pBuf, bit_offset, ENDPOINT_BITS);
		
	uint32_t pbits[4];
	for (uint32_t p = 0; p < PBITS; p++)
		pbits[p] = read_bits32(pBuf, bit_offset, 1);
						
	uint32_t weights[16];
	for (uint32_t i = 0; i < 16; i++)
		weights[i] = read_bits32(pBuf, bit_offset, ((!i) || (i == g_bc7_table_anchor_index_second_subset[part])) ? (WEIGHT_BITS - 1) : WEIGHT_BITS);
		
	assert(bit_offset == 128);

	for (uint32_t e = 0; e < ENDPOINTS; e++)
		for (uint32_t c = 0; c < 4; c++)
			endpoints[e][c] = (uint8_t)((c == ((mode == 7U) ? 4U : 3U)) ? 255 : bc7_dequant(endpoints[e][c], pbits[SHARED_PBITS ? (e >> 1) : e], ENDPOINT_BITS));
		
	color_rgba block_colors[2][8];
	for (uint32_t s = 0; s < 2; s++)
		for (uint32_t i = 0; i < WEIGHT_VALS; i++)
		{
			for (uint32_t c = 0; c < COMPS; c++)
				block_colors[s][i][c] = (uint8_t)bc7_interp(endpoints[s * 2 + 0][c], endpoints[s * 2 + 1][c], i, WEIGHT_BITS);
			block_colors[s][i][3] = (COMPS == 3) ? 255 : block_colors[s][i][3];
		}

	for (uint32_t i = 0; i < 16; i++)
		pPixels[i] = block_colors[g_bc7_partition2[part * 16 + i]][weights[i]];

	return true;
}